

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<unsigned_long_long>
          (Capturer *this,size_t index,unsigned_long_long *value)

{
  string local_40;
  unsigned_long_long *local_20;
  unsigned_long_long *value_local;
  size_t index_local;
  Capturer *this_local;
  
  local_20 = value;
  value_local = (unsigned_long_long *)index;
  index_local = (size_t)this;
  Detail::stringify<unsigned_long_long>(&local_40,value);
  captureValue(this,index,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void captureValues( size_t index, T const& value ) {
            captureValue( index, Catch::Detail::stringify( value ) );
        }